

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O3

bool __thiscall QAssociativeIterable::containsKey(QAssociativeIterable *this,QVariant *key)

{
  uint uVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  QMetaType local_58;
  QMetaContainer local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  local_30 = 2;
  local_50.d_ptr =
       (this->super_QIterable<QMetaAssociation>).m_metaContainer.super_QMetaContainer.d_ptr;
  local_58 = QMetaAssociation::keyMetaType((QMetaAssociation *)&local_50);
  pvVar2 = QtPrivate::QVariantTypeCoercer::convert((QVariantTypeCoercer *)&local_48,key,&local_58);
  if (pvVar2 != (void *)0x0) {
    if ((local_50.d_ptr == (QMetaContainerInterface *)0x0) ||
       (local_50.d_ptr[1].destroyIteratorFn == (DestroyIteratorFn)0x0)) {
      this = (QAssociativeIterable *)0x0;
    }
    else {
      uVar1 = (*local_50.d_ptr[1].destroyIteratorFn)
                        ((void *)((this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d &
                                 0xfffffffffffffffe));
      this = (QAssociativeIterable *)(ulong)uVar1;
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)(pvVar2 != (void *)0x0 & (byte)this);
  }
  __stack_chk_fail();
}

Assistant:

bool QAssociativeIterable::containsKey(const QVariant &key)
{
    QtPrivate::QVariantTypeCoercer keyCoercer;
    QMetaAssociation meta = metaContainer();
    if (const void *keyData = keyCoercer.convert(key, meta.keyMetaType()))
        return meta.containsKey(constIterable(), keyData);
    return false;
}